

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O3

bool __thiscall re2::RE2::CheckRewriteString(RE2 *this,StringPiece *rewrite,string *error)

{
  char *pcVar1;
  char *pcVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  string local_30;
  
  if ((long)rewrite->size_ < 1) {
    uVar3 = 0xffffffff;
  }
  else {
    pcVar2 = rewrite->data_;
    pcVar1 = pcVar2 + rewrite->size_;
    uVar3 = 0xffffffff;
    do {
      if (*pcVar2 == '\\') {
        pcVar2 = pcVar2 + 1;
        if (pcVar2 == pcVar1) {
          pcVar2 = (char *)error->_M_string_length;
          pcVar1 = "Rewrite schema error: \'\\\' not allowed at end.";
LAB_0013874d:
          std::__cxx11::string::_M_replace((ulong)error,0,pcVar2,(ulong)pcVar1);
          return false;
        }
        if (*pcVar2 != 0x5c) {
          uVar4 = (int)*pcVar2 - 0x30;
          if (9 < uVar4) {
            pcVar2 = (char *)error->_M_string_length;
            pcVar1 = "Rewrite schema error: \'\\\' must be followed by a digit or \'\\\'.";
            goto LAB_0013874d;
          }
          if ((int)uVar3 <= (int)uVar4) {
            uVar3 = uVar4;
          }
        }
      }
      pcVar2 = pcVar2 + 1;
    } while (pcVar2 < pcVar1);
  }
  bVar5 = true;
  if (this->num_captures_ < (int)uVar3) {
    StringPrintf_abi_cxx11_
              (&local_30,
               "Rewrite schema requests %d matches, but the regexp only has %d parenthesized subexpressions."
              );
    std::__cxx11::string::operator=((string *)error,(string *)&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p);
    }
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool RE2::CheckRewriteString(const StringPiece& rewrite,
                             std::string* error) const {
  int max_token = -1;
  for (const char *s = rewrite.data(), *end = s + rewrite.size();
       s < end; s++) {
    int c = *s;
    if (c != '\\') {
      continue;
    }
    if (++s == end) {
      *error = "Rewrite schema error: '\\' not allowed at end.";
      return false;
    }
    c = *s;
    if (c == '\\') {
      continue;
    }
    if (!isdigit(c)) {
      *error = "Rewrite schema error: "
               "'\\' must be followed by a digit or '\\'.";
      return false;
    }
    int n = (c - '0');
    if (max_token < n) {
      max_token = n;
    }
  }

  if (max_token > NumberOfCapturingGroups()) {
    *error = StringPrintf(
        "Rewrite schema requests %d matches, but the regexp only has %d "
        "parenthesized subexpressions.",
        max_token, NumberOfCapturingGroups());
    return false;
  }
  return true;
}